

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

UBool __thiscall
icu_63::TimeArrayTimeZoneRule::initStartTimes
          (TimeArrayTimeZoneRule *this,UDate *source,int32_t size,UErrorCode *status)

{
  UDate *pUVar1;
  UDate *pUVar2;
  
  pUVar2 = this->fStartTimes;
  pUVar1 = this->fLocalStartTimes;
  if (pUVar2 != pUVar1 && pUVar2 != (UDate *)0x0) {
    uprv_free_63(pUVar2);
  }
  if (size < 0x21) {
    this->fStartTimes = pUVar1;
  }
  else {
    pUVar2 = (UDate *)uprv_malloc_63((ulong)(uint)size << 3);
    this->fStartTimes = pUVar2;
    if (pUVar2 == (UDate *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      goto LAB_00212f2f;
    }
  }
  memcpy(this->fStartTimes,source,(long)size << 3);
  this->fNumStartTimes = size;
  uprv_sortArray_63(this->fStartTimes,size,8,compareDates,(void *)0x0,'\x01',status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    return '\x01';
  }
  pUVar2 = this->fStartTimes;
  if (pUVar2 != pUVar1 && pUVar2 != (UDate *)0x0) {
    uprv_free_63(pUVar2);
  }
LAB_00212f2f:
  this->fNumStartTimes = 0;
  return '\0';
}

Assistant:

UBool
TimeArrayTimeZoneRule::initStartTimes(const UDate source[], int32_t size, UErrorCode& status) {
    // Free old array
    if (fStartTimes != NULL && fStartTimes != fLocalStartTimes) {
        uprv_free(fStartTimes);
    }
    // Allocate new one if needed
    if (size > TIMEARRAY_STACK_BUFFER_SIZE) {
        fStartTimes = (UDate*)uprv_malloc(sizeof(UDate)*size);
        if (fStartTimes == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            fNumStartTimes = 0;
            return FALSE;
        }
    } else {
        fStartTimes = (UDate*)fLocalStartTimes;
    }
    uprv_memcpy(fStartTimes, source, sizeof(UDate)*size);
    fNumStartTimes = size;
    // Sort dates
    uprv_sortArray(fStartTimes, fNumStartTimes, (int32_t)sizeof(UDate), compareDates, NULL, TRUE, &status);
    if (U_FAILURE(status)) {
        if (fStartTimes != NULL && fStartTimes != fLocalStartTimes) {
            uprv_free(fStartTimes);
        }
        fNumStartTimes = 0;
        return FALSE;
    }
    return TRUE;
}